

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

void list_prepend_to(list_t *list,void *data,list_node_t *old)

{
  list_node_t *plVar1;
  list_node_t *new;
  list_node_t *old_local;
  void *data_local;
  list_t *list_local;
  
  plVar1 = list_node_new();
  plVar1->data = data;
  if (old->prev == (list_node_t *)0x0) {
    list->head = plVar1;
  }
  else {
    old->prev->next = plVar1;
  }
  plVar1->prev = old->prev;
  plVar1->next = old;
  old->prev = plVar1;
  return;
}

Assistant:

void
list_prepend_to(
    list_t* list,
    void* data,
    list_node_t* old)
{
    list_node_t* new = list_node_new();
    new->data = data;

    if (old->prev)
        old->prev->next = new;
    else
        list->head = new;
    new->prev = old->prev;
    new->next = old;
    old->prev = new;
}